

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

Ignored __thiscall
duckdb_re2::NamedCapturesWalker::PreVisit
          (NamedCapturesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  int iVar1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *this_00;
  string *psVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  if ((re->op_ == '\v') && (psVar2 = (re->arguments).capture.name_, psVar2 != (string *)0x0)) {
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               *)this->map_;
    if (this_00 ==
        (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
         *)0x0) {
      this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 *)operator_new(0x30);
      *(_Rb_tree_color *)(this_00 + 8) = _S_red;
      *(_Base_ptr *)(this_00 + 0x10) = (_Base_ptr)0x0;
      *(_Base_ptr *)(this_00 + 0x18) = (_Base_ptr)(this_00 + 8);
      *(_Base_ptr *)(this_00 + 0x20) = (_Base_ptr)(this_00 + 8);
      *(size_t *)(this_00 + 0x28) = 0;
      this->map_ = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)this_00;
      psVar2 = (re->arguments).capture.name_;
    }
    iVar1 = (re->arguments).repeat.max_;
    std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
    local_50.second = iVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,int>>(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return ignored;
}

Assistant:

virtual Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new std::map<std::string, int>;

      // Record first occurrence of each name.
      // (The rule is that if you have the same name
      // multiple times, only the leftmost one counts.)
      map_->insert({*re->name(), re->cap()});
    }
    return ignored;
  }